

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

hts_itr_t * hts_itr_query(hts_idx_t *idx,int tid,int beg,int end,hts_readrec_func *readrec)

{
  kh_bin_t *pkVar1;
  bins_t *pbVar2;
  ulong uVar3;
  undefined4 uVar4;
  int32_t iVar5;
  khint_t kVar6;
  int iVar7;
  lidx_t *a;
  lidx_t *plVar8;
  hts_pair64_t *phVar9;
  lidx_t *plVar10;
  ulong local_a0;
  bins_t *p;
  int j;
  int first;
  khint_t k_1;
  uint64_t off0;
  int finished0;
  hts_itr_t *iter;
  uint64_t min_off;
  bidx_t *bidx;
  khint_t k;
  hts_pair64_t *off;
  int bin;
  int l;
  int n_off;
  int i;
  hts_readrec_func *readrec_local;
  int local_20;
  int end_local;
  int beg_local;
  int tid_local;
  hts_idx_t *idx_local;
  
  if (tid < 0) {
    off0._4_4_ = 0;
    _first = (bidx_t **)0xffffffffffffffff;
    switch(tid) {
    case -5:
      off0._4_4_ = 1;
      _first = (bidx_t **)0x0;
      break;
    case -4:
      _first = (bidx_t **)0x0;
      break;
    case -3:
      for (l = 0; l < idx->n; l = l + 1) {
        pkVar1 = idx->bidx[l];
        kVar6 = kh_get_bin(pkVar1,idx->n_bins + 1);
        if ((kVar6 != pkVar1->n_buckets) && ((bidx_t **)(pkVar1->vals[kVar6].list)->u < _first)) {
          _first = (bidx_t **)(pkVar1->vals[kVar6].list)->u;
        }
      }
      if ((_first == (bidx_t **)0xffffffffffffffff) && (idx->n_no_coor != 0)) {
        _first = (bidx_t **)0x0;
      }
      break;
    case -2:
      if (0 < idx->n) {
        pkVar1 = idx->bidx[idx->n + -1];
        kVar6 = kh_get_bin(pkVar1,idx->n_bins + 1);
        if (kVar6 != pkVar1->n_buckets) {
          _first = (bidx_t **)(pkVar1->vals[kVar6].list)->v;
        }
      }
      if ((_first == (bidx_t **)0xffffffffffffffff) && (idx->n_no_coor != 0)) {
        _first = (bidx_t **)0x0;
      }
      break;
    default:
      return (hts_itr_t *)0x0;
    }
    if (_first == (bidx_t **)0xffffffffffffffff) {
      idx_local = (hts_idx_t *)0x0;
    }
    else {
      idx_local = (hts_idx_t *)calloc(1,0x50);
      idx_local->fmt = idx_local->fmt & 0xfffffffeU | 1;
      idx_local->fmt = idx_local->fmt & 0xfffffffdU | off0._4_4_ << 1;
      idx_local->bidx = _first;
      idx_local->meta = (uint8_t *)readrec;
    }
  }
  else {
    local_20 = beg;
    if (beg < 0) {
      local_20 = 0;
    }
    if (end < local_20) {
      idx_local = (hts_idx_t *)0x0;
    }
    else if ((tid < idx->n) && (pkVar1 = idx->bidx[tid], pkVar1 != (kh_bin_t *)0x0)) {
      idx_local = (hts_idx_t *)calloc(1,0x50);
      idx_local->min_shift = tid;
      idx_local->n_lvls = local_20;
      idx_local->n_bins = end;
      idx_local->n = -1;
      idx_local->meta = (uint8_t *)readrec;
      off._0_4_ = ((1 << ((char)(idx->n_lvls << 1) + (char)idx->n_lvls & 0x1fU)) + -1) / 7 +
                  (local_20 >> ((byte)idx->min_shift & 0x1f));
      do {
        bidx._4_4_ = kh_get_bin(pkVar1,(khint32_t)off);
        if (bidx._4_4_ != pkVar1->n_buckets) break;
        if (((int)((khint32_t)off - 1) >> 3) * 8 + 1 < (int)(khint32_t)off) {
          off._0_4_ = (khint32_t)off - 1;
        }
        else {
          off._0_4_ = (int)((khint32_t)off - 1) >> 3;
        }
      } while ((khint32_t)off != 0);
      if ((khint32_t)off == 0) {
        bidx._4_4_ = kh_get_bin(pkVar1,0);
      }
      if (bidx._4_4_ == pkVar1->n_buckets) {
        local_a0 = 0;
      }
      else {
        local_a0 = pkVar1->vals[bidx._4_4_].loff;
      }
      reg2bins((long)local_20,(long)end,(hts_itr_t *)idx_local,idx->min_shift,idx->n_lvls);
      bin = 0;
      for (l = 0; l < (int)(idx_local->z).last_bin; l = l + 1) {
        kVar6 = kh_get_bin(pkVar1,(*(int **)&(idx_local->z).last_coor)[l]);
        if (kVar6 != pkVar1->n_buckets) {
          bin = pkVar1->vals[kVar6].n + bin;
        }
      }
      if (bin != 0) {
        a = (lidx_t *)calloc((long)bin,0x10);
        bin = 0;
        for (l = 0; l < (int)(idx_local->z).last_bin; l = l + 1) {
          kVar6 = kh_get_bin(pkVar1,(*(int **)&(idx_local->z).last_coor)[l]);
          if (kVar6 != pkVar1->n_buckets) {
            pbVar2 = pkVar1->vals;
            for (p._4_4_ = 0; p._4_4_ < pbVar2[kVar6].n; p._4_4_ = p._4_4_ + 1) {
              if (local_a0 < pbVar2[kVar6].list[p._4_4_].v) {
                plVar8 = a + bin;
                phVar9 = pbVar2[kVar6].list + p._4_4_;
                uVar4 = *(undefined4 *)((long)&phVar9->u + 4);
                plVar8->n = *(undefined4 *)&phVar9->u;
                plVar8->m = uVar4;
                plVar8->offset = (uint64_t *)phVar9->v;
                bin = bin + 1;
              }
            }
          }
        }
        if (bin == 0) {
          free(a);
        }
        else {
          ks_introsort__off((long)bin,(hts_pair64_t *)a);
          off._4_4_ = 0;
          for (l = 1; l < bin; l = l + 1) {
            if (a[off._4_4_].offset < a[l].offset) {
              off._4_4_ = off._4_4_ + 1;
              plVar8 = a + off._4_4_;
              plVar10 = a + l;
              iVar5 = plVar10->m;
              plVar8->n = plVar10->n;
              plVar8->m = iVar5;
              plVar8->offset = plVar10->offset;
            }
          }
          iVar7 = off._4_4_ + 1;
          for (l = 1; l < iVar7; l = l + 1) {
            if (*(uint64_t **)(a + l) <= a[l + -1].offset) {
              a[l + -1].offset = *(uint64_t **)(a + l);
            }
          }
          off._4_4_ = 0;
          for (l = 1; l < iVar7; l = l + 1) {
            uVar3._0_4_ = a[l].n;
            uVar3._4_4_ = a[l].m;
            if ((ulong)a[off._4_4_].offset >> 0x10 == uVar3 >> 0x10) {
              a[off._4_4_].offset = a[l].offset;
            }
            else {
              off._4_4_ = off._4_4_ + 1;
              plVar8 = a + off._4_4_;
              plVar10 = a + l;
              iVar5 = plVar10->m;
              plVar8->n = plVar10->n;
              plVar8->m = iVar5;
              plVar8->offset = plVar10->offset;
            }
          }
          idx_local->l_meta = off._4_4_ + 1;
          idx_local->lidx = a;
        }
      }
    }
    else {
      idx_local = (hts_idx_t *)0x0;
    }
  }
  return (hts_itr_t *)idx_local;
}

Assistant:

hts_itr_t *hts_itr_query(const hts_idx_t *idx, int tid, int beg, int end, hts_readrec_func *readrec)
{
    int i, n_off, l, bin;
    hts_pair64_t *off;
    khint_t k;
    bidx_t *bidx;
    uint64_t min_off;
    hts_itr_t *iter = 0;
    if (tid < 0) {
        int finished0 = 0;
        uint64_t off0 = (uint64_t)-1;
        khint_t k;
        switch (tid) {
        case HTS_IDX_START:
            // Find the smallest offset, note that sequence ids may not be ordered sequentially
            for (i=0; i<idx->n; i++)
            {
                bidx = idx->bidx[i];
                k = kh_get(bin, bidx, META_BIN(idx));
                if (k == kh_end(bidx)) continue;
                if ( off0 > kh_val(bidx, k).list[0].u ) off0 = kh_val(bidx, k).list[0].u;
            }
            if ( off0==(uint64_t)-1 && idx->n_no_coor ) off0 = 0; // only no-coor reads in this bam
            break;

        case HTS_IDX_NOCOOR:
            if ( idx->n>0 )
            {
                bidx = idx->bidx[idx->n - 1];
                k = kh_get(bin, bidx, META_BIN(idx));
                if (k != kh_end(bidx)) off0 = kh_val(bidx, k).list[0].v;
            }
            if ( off0==(uint64_t)-1 && idx->n_no_coor ) off0 = 0; // only no-coor reads in this bam
            break;

        case HTS_IDX_REST:
            off0 = 0;
            break;

        case HTS_IDX_NONE:
            finished0 = 1;
            off0 = 0;
            break;

        default:
            return 0;
        }
        if (off0 != (uint64_t)-1) {
            iter = (hts_itr_t*)calloc(1, sizeof(hts_itr_t));
            iter->read_rest = 1;
            iter->finished = finished0;
            iter->curr_off = off0;
            iter->readrec = readrec;
            return iter;
        } else return 0;
    }

    if (beg < 0) beg = 0;
    if (end < beg) return 0;
    if (tid >= idx->n || (bidx = idx->bidx[tid]) == NULL) return 0;

    iter = (hts_itr_t*)calloc(1, sizeof(hts_itr_t));
    iter->tid = tid, iter->beg = beg, iter->end = end; iter->i = -1;
    iter->readrec = readrec;

    // compute min_off
    bin = hts_bin_first(idx->n_lvls) + (beg>>idx->min_shift);
    do {
        int first;
        k = kh_get(bin, bidx, bin);
        if (k != kh_end(bidx)) break;
        first = (hts_bin_parent(bin)<<3) + 1;
        if (bin > first) --bin;
        else bin = hts_bin_parent(bin);
    } while (bin);
    if (bin == 0) k = kh_get(bin, bidx, bin);
    min_off = k != kh_end(bidx)? kh_val(bidx, k).loff : 0;
    // retrieve bins
    reg2bins(beg, end, iter, idx->min_shift, idx->n_lvls);
    for (i = n_off = 0; i < iter->bins.n; ++i)
        if ((k = kh_get(bin, bidx, iter->bins.a[i])) != kh_end(bidx))
            n_off += kh_value(bidx, k).n;
    if (n_off == 0) return iter;
    off = (hts_pair64_t*)calloc(n_off, sizeof(hts_pair64_t));
    for (i = n_off = 0; i < iter->bins.n; ++i) {
        if ((k = kh_get(bin, bidx, iter->bins.a[i])) != kh_end(bidx)) {
            int j;
            bins_t *p = &kh_value(bidx, k);
            for (j = 0; j < p->n; ++j)
                if (p->list[j].v > min_off) off[n_off++] = p->list[j];
        }
    }
    if (n_off == 0) {
        free(off); return iter;
    }
    ks_introsort(_off, n_off, off);
    // resolve completely contained adjacent blocks
    for (i = 1, l = 0; i < n_off; ++i)
        if (off[l].v < off[i].v) off[++l] = off[i];
    n_off = l + 1;
    // resolve overlaps between adjacent blocks; this may happen due to the merge in indexing
    for (i = 1; i < n_off; ++i)
        if (off[i-1].v >= off[i].u) off[i-1].v = off[i].u;
    // merge adjacent blocks
    for (i = 1, l = 0; i < n_off; ++i) {
        if (off[l].v>>16 == off[i].u>>16) off[l].v = off[i].v;
        else off[++l] = off[i];
    }
    n_off = l + 1;
    iter->n_off = n_off; iter->off = off;
    return iter;
}